

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExecutionContext.cpp
# Opt level: O3

void __thiscall
rsg::ExecutionContext::andExecutionMask(ExecutionContext *this,ExecConstValueAccess value)

{
  pointer pEVar1;
  int i_1;
  bool bVar2;
  VariableType *pVVar3;
  int i;
  long lVar4;
  ExecConstValueAccess value_00;
  ExecMaskStorage tmp;
  Scalar local_118 [64];
  
  lVar4 = 0;
  pVVar3 = (VariableType *)0x0;
  memset(local_118,0,0x100);
  do {
    local_118[lVar4].boolVal = true;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x40);
  VariableType::getScalarType(TYPE_BOOL);
  pEVar1 = (this->m_execMaskStack).
           super__Vector_base<rsg::ExecMaskStorage,_std::allocator<rsg::ExecMaskStorage>_>._M_impl.
           super__Vector_impl_data._M_finish;
  VariableType::getScalarType(TYPE_BOOL);
  lVar4 = 0;
  do {
    if (pEVar1[-1].m_data[lVar4].boolVal == true) {
      bVar2 = value.m_value[lVar4].boolVal;
    }
    else {
      bVar2 = false;
    }
    local_118[lVar4].boolVal = bVar2;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x40);
  value_00.m_value = local_118;
  value_00.m_type = pVVar3;
  pushExecutionMask(this,value_00);
  return;
}

Assistant:

void ExecutionContext::andExecutionMask (ExecConstValueAccess value)
{
	ExecMaskStorage			tmp;
	ExecValueAccess			newValue	= tmp.getValue();
	ExecConstValueAccess	oldValue	= getExecutionMask();

	for (int i = 0; i < EXEC_VEC_WIDTH; i++)
		newValue.asBool(i) = oldValue.asBool(i) && value.asBool(i);

	pushExecutionMask(newValue);
}